

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O2

void __thiscall VGMPlayer::Cmd_QSound_Reg(VGMPlayer *this)

{
  byte bVar1;
  _func_void_CHIP_DEVICE_ptr_UINT8_UINT16 *p_Var2;
  byte bVar3;
  CHIP_DEVICE *pCVar4;
  ushort uVar5;
  byte bVar6;
  
  pCVar4 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,'\0');
  p_Var2 = this->_qsWork[0].write;
  if (p_Var2 == (_func_void_CHIP_DEVICE_ptr_UINT8_UINT16 *)0x0 || pCVar4 == (CHIP_DEVICE *)0x0) {
    return;
  }
  if ((pCVar4->flags & 1) != 0) {
    bVar1 = this->_fileData[(ulong)this->_filePos + 3];
    if (-1 < (char)bVar1) {
      bVar3 = bVar1 >> 3;
      bVar6 = bVar1 & 7;
      if (bVar6 == 3) {
        (*p_Var2)(pCVar4,(bVar1 & 0x78) + 1,this->_qsWork[0].startAddrCache[bVar3]);
      }
      else {
        uVar5 = *(ushort *)(this->_fileData + (ulong)this->_filePos + 1);
        uVar5 = uVar5 << 8 | uVar5 >> 8;
        if (bVar6 == 2) {
          if ((uVar5 != 0) && (this->_qsWork[0].pitchCache[bVar3] == 0)) {
            (*p_Var2)(pCVar4,(bVar1 & 0x78) + 1,this->_qsWork[0].startAddrCache[bVar3]);
          }
          this->_qsWork[0].pitchCache[bVar3] = uVar5;
        }
        else if (bVar6 == 1) {
          this->_qsWork[0].startAddrCache[bVar3] = uVar5;
        }
      }
    }
  }
  uVar5 = *(ushort *)(this->_fileData + (ulong)this->_filePos + 1);
  (*this->_qsWork[0].write)
            (pCVar4,this->_fileData[(ulong)this->_filePos + 3],uVar5 << 8 | uVar5 >> 8);
  return;
}

Assistant:

void VGMPlayer::Cmd_QSound_Reg(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = 0;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	QSOUND_WORK* qsWork = &_qsWork[chipID];
	if (cDev == NULL || qsWork->write == NULL)
		return;
	
	if (cDev->flags & 0x01)	// enable hacks for proper playback of old VGMs with a good QSound core
	{
		UINT8 offset = fData[0x03];
		// need to handle three cases, as vgm_cmp can remove writes to both phase and bank
		// registers, depending on version.
		// - start address was written before end/loop, but phase register is written
		// - as above, but phase is not written (we use bank as a backup then)
		// - voice parameters are written during a note (we can't rewrite the address then)
		if (offset < 0x80)
		{
			UINT8 chn = offset >> 3;
			UINT16 data = ReadBE16(&fData[0x01]);
			
			switch(offset & 0x07)
			{
			case 0x01:	// Start Address
				qsWork->startAddrCache[chn] = data;
				break;
			case 0x02:	// Pitch
				// old HLE assumed writing a non-zero value after a zero value was Key On
				if (! qsWork->pitchCache[chn] && data)
					qsWork->write(cDev, (chn << 3) | 0x01, qsWork->startAddrCache[chn]);
				qsWork->pitchCache[chn] = data;
				break;
			case 0x03: // Phase (old HLE also assumed this was Key On)
				qsWork->write(cDev, (chn << 3) | 0x01, qsWork->startAddrCache[chn]);
				break;
			}
		}
	}
	
	qsWork->write(cDev, fData[0x03], ReadBE16(&fData[0x01]));
	return;
}